

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall DivideTest<long>::run(DivideTest<long> *this)

{
  int iVar1;
  int i;
  ulong uVar2;
  UT denom;
  long lVar3;
  long lVar4;
  long denom_00;
  set_t<long> tested_denom;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar3 = 1;
  lVar4 = -1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    test_all_algorithms(this,lVar3,(set_t<long> *)&local_60);
    test_all_algorithms(this,lVar4,(set_t<long> *)&local_60);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != -0x400);
  test_all_algorithms(this,-0x8000000000000000,(set_t<long> *)&local_60);
  test_all_algorithms(this,0x7fffffffffffffff,(set_t<long> *)&local_60);
  uVar2 = 1;
  do {
    lVar3 = 1L << (uVar2 & 0x3f);
    denom_00 = 1 - lVar3;
    lVar4 = -1;
    do {
      test_all_algorithms(this,lVar3 + lVar4,(set_t<long> *)&local_60);
      test_all_algorithms(this,denom_00,(set_t<long> *)&local_60);
      lVar4 = lVar4 + 1;
      denom_00 = denom_00 + -1;
    } while (lVar4 != 2);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x3f);
  iVar1 = 10000;
  do {
    lVar3 = random_denominator(this);
    test_all_algorithms(this,lVar3,(set_t<long> *)&local_60);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void run() {
        set_t<T> tested_denom;

        // Test small values
#if defined(__AVR__)
        UT primes[] = {2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37, 41, 43, 47, 53, 59, 61, 67, 71,
            73, 79, 83, 89, 97, 101, 103, 107, 109, 113, 127, 131, 137, 139, 149, 151, 157, 163,
            167, 173};
        for (size_t index = 0; index < sizeof(primes) / sizeof(primes[0]); ++index) {
            test_both_signs(primes[index], tested_denom);
        }
#else
        for (UT denom = 1; denom < 1024; ++denom) {
            test_both_signs(denom, tested_denom);
        }
#endif

        if (limits::is_signed) {
            PRINT_PROGRESS_MSG(F("Testing minimum\n"));
            test_all_algorithms((limits::min)(), tested_denom);
        }

        PRINT_PROGRESS_MSG(F("Testing maximum\n"));
        test_all_algorithms((limits::max)(), tested_denom);

        // test power of 2 denoms: 2^i-1, 2^i, 2^i+1
        PRINT_PROGRESS_MSG(F("Testing powers of 2\n"));
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T denom = static_cast<UT>((static_cast<T>(1) << i) + j);

                test_both_signs(denom, tested_denom);
            }
        }

        // test all bits set:
        // 11111111, 11111110, 11111100, ...
        PRINT_PROGRESS_MSG(F("Testing all bits set\n"));
        // For signed types, this degenerates to negative powers of
        // 2 (-1, -2, -4....): since we just tested those (above), skip.
        if (!limits::is_signed) {
            for (UT bits = (std::numeric_limits<UT>::max)(); bits != 0; bits <<= 1) {
                PRINT_PROGRESS_MSG((T)bits);
                PRINT_PROGRESS_MSG("\n");
                test_all_algorithms((T)bits, tested_denom);
            }
        }

        // Test random denominators
#if !defined(__AVR__)
        PRINT_PROGRESS_MSG(F("Test random denominators\n"));
        for (int i = 0; i < 10000; ++i) {
            test_all_algorithms(random_denominator(), tested_denom);
        }
#endif
    }